

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.H
# Opt level: O3

void __thiscall
amrex::EB2::GShopLevel<amrex::STLtools>::GShopLevel
          (GShopLevel<amrex::STLtools> *this,IndexSpace *is,int param_2,int max_grid_size,
          int param_4,Geometry *geom,GShopLevel<amrex::STLtools> *fineLevel)

{
  uint uVar1;
  element_type *peVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  IntVect ngrow;
  Level LStack_1af8;
  
  Level::Level(&this->super_Level,is,geom);
  if ((fineLevel->super_Level).m_allregular == true) {
    (this->super_Level).m_allregular = true;
    (this->super_Level).m_ok = true;
  }
  else {
    bVar4 = BoxArray::coarsenable(&(fineLevel->super_Level).m_grids,2,8);
    if (bVar4) {
      peVar2 = (fineLevel->super_Level).m_covered_grids.m_ref.
               super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start ==
          *(pointer *)
           ((long)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data + 8)) {
        bVar4 = true;
      }
      else {
        bVar4 = BoxArray::coarsenable(&(fineLevel->super_Level).m_covered_grids,2,1);
      }
    }
    else {
      bVar4 = false;
    }
    uVar3 = *(ulong *)(fineLevel->super_Level).m_ngrow.vect;
    uVar1 = (fineLevel->super_Level).m_ngrow.vect[2];
    uVar6 = uVar3 >> 0x21;
    if ((long)uVar3 < 0) {
      uVar6 = (ulong)(uint)((long)uVar3 >> 0x21);
    }
    *(ulong *)(this->super_Level).m_ngrow.vect =
         (ulong)(uint)((int)(uint)uVar3 >> 1) | uVar6 << 0x20;
    (this->super_Level).m_ngrow.vect[2] = (int)uVar1 >> 1;
    if (((((uint)uVar3 & 0xfffffffe) != (fineLevel->super_Level).m_ngrow.vect[0]) ||
        ((int)uVar6 * 2 != (fineLevel->super_Level).m_ngrow.vect[1])) ||
       ((uVar1 & 0xfffffffe) != (fineLevel->super_Level).m_ngrow.vect[2])) {
      (this->super_Level).m_ngrow.vect[0] = 0;
      (this->super_Level).m_ngrow.vect[1] = 0;
      (this->super_Level).m_ngrow.vect[2] = 0;
    }
    if (bVar4 == false) {
      Level::Level(&LStack_1af8,is,(Geometry *)fineLevel);
      ngrow.vect._0_8_ =
           (ulong)(uint)(this->super_Level).m_ngrow.vect[1] << 0x21 |
           (ulong)(uint)((this->super_Level).m_ngrow.vect[0] * 2);
      ngrow.vect[2] = (this->super_Level).m_ngrow.vect[2] * 2;
      Level::prepareForCoarsening(&LStack_1af8,&fineLevel->super_Level,max_grid_size,ngrow);
      iVar5 = Level::coarsenFromFine(&this->super_Level,&LStack_1af8,false);
      (this->super_Level).m_ok = iVar5 == 0;
      Level::~Level(&LStack_1af8);
    }
    else {
      iVar5 = Level::coarsenFromFine(&this->super_Level,&fineLevel->super_Level,true);
      (this->super_Level).m_ok = iVar5 == 0;
    }
  }
  return;
}

Assistant:

GShopLevel<G>::GShopLevel (IndexSpace const* is, int /*ilev*/, int max_grid_size, int /*ngrow*/,
                           const Geometry& geom, GShopLevel<G>& fineLevel)
    : Level(is, geom)
{
    if (fineLevel.isAllRegular()) {
        m_allregular = true;
        m_ok = true;
        return;
    }

    BL_PROFILE("EB2::GShopLevel()-coarse");

    const BoxArray& fine_grids = fineLevel.m_grids;
    const BoxArray& fine_covered_grids = fineLevel.m_covered_grids;

    const int coarse_ratio = 2;
    const int min_width = 8;
    bool coarsenable = fine_grids.coarsenable(coarse_ratio, min_width)
        && (fine_covered_grids.empty() || fine_covered_grids.coarsenable(coarse_ratio));

    m_ngrow = amrex::coarsen(fineLevel.m_ngrow,2);
    if (amrex::scale(m_ngrow,2) != fineLevel.m_ngrow) {
        m_ngrow = IntVect::TheZeroVector();
    }

    if (coarsenable)
    {
        int ierr = coarsenFromFine(fineLevel, true);
        m_ok = (ierr == 0);
    }
    else
    {
        Level fine_level_2(is, fineLevel.m_geom);
        fine_level_2.prepareForCoarsening(fineLevel, max_grid_size, amrex::scale(m_ngrow,2));
        int ierr = coarsenFromFine(fine_level_2, false);
        m_ok = (ierr == 0);
    }
}